

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O2

void ftest_insert(planck_unit_test_t *tc,ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value,
                 ion_err_t expected_status,ion_result_count_t expected_count,
                 ion_boolean_t check_result)

{
  long lVar1;
  FILE *pFVar2;
  size_t __n;
  undefined8 uVar3;
  planck_unit_result_t pVar4;
  ion_err_t iVar5;
  char cVar6;
  int iVar7;
  ion_status_t iVar8;
  ulong uVar9;
  size_t sVar10;
  undefined7 in_register_00000081;
  long location;
  undefined1 *__s2;
  undefined1 *__ptr;
  size_t sStack_70;
  undefined1 local_68 [8];
  ion_flat_file_row_t test_row;
  
  sStack_70 = 0x101445;
  iVar8 = flat_file_insert(flat_file,key,value);
  sStack_70 = 0x101462;
  pVar4 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000081,expected_status),(int)iVar8.error,
                     0x83,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                    );
  __ptr = local_68;
  if (pVar4 != '\0') {
    sStack_70 = 0x101487;
    pVar4 = planck_unit_assert_int_are_equal
                      (tc,expected_count,iVar8.count,0x84,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                      );
    __ptr = local_68;
    if (pVar4 != '\0') {
      if (check_result != '\0') {
        uVar9 = flat_file->row_size + 0xf & 0xfffffffffffffff0;
        lVar1 = -uVar9;
        __s2 = local_68 + lVar1;
        test_row.value = local_68;
        local_68[-uVar9] = 1;
        sVar10 = (size_t)(flat_file->super).record.key_size;
        *(undefined8 *)(local_68 + lVar1 + -8) = 0x1014d4;
        memcpy(local_68 + lVar1 + 1,key,sVar10);
        iVar7 = (flat_file->super).record.value_size;
        *(undefined8 *)(local_68 + lVar1 + -8) = 0x1014e8;
        memcpy(__s2 + sVar10 + 1,value,(long)iVar7);
        __ptr = __s2 + -(flat_file->row_size + 0xf & 0xfffffffffffffff0);
        lVar1 = flat_file->start_of_data;
        pFVar2 = (FILE *)flat_file->data_file;
        location = 0;
        *(undefined8 *)(__ptr + -8) = 0x10150f;
        fseek(pFVar2,lVar1,0);
        sVar10 = flat_file->row_size;
        while( true ) {
          pFVar2 = (FILE *)flat_file->data_file;
          *(undefined8 *)(__ptr + -8) = 1;
          __n = *(size_t *)(__ptr + -8);
          *(undefined8 *)(__ptr + -8) = 0x101525;
          sVar10 = fread(__ptr,sVar10,__n,pFVar2);
          if (sVar10 != 1) break;
          sVar10 = flat_file->row_size;
          *(undefined8 *)(__ptr + -8) = 0x10153d;
          iVar7 = bcmp(__ptr,__s2,sVar10);
          if (iVar7 == 0) {
            *(undefined8 *)(__ptr + -8) = 0x101578;
            iVar5 = flat_file_read_row(flat_file,location,(ion_flat_file_row_t *)local_68);
            *(undefined8 *)(__ptr + -8) = 0x101595;
            pVar4 = planck_unit_assert_int_are_equal
                              (tc,0,(int)iVar5,0x9c,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                              );
            if (pVar4 == '\0') goto LAB_00101629;
            *(undefined8 *)(__ptr + -8) = 1;
            uVar3 = *(undefined8 *)(__ptr + -8);
            *(undefined8 *)(__ptr + -8) = 0x1015b8;
            pVar4 = planck_unit_assert_int_are_equal
                              (tc,(int32_t)uVar3,(uint)local_68[0],0x9d,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                              );
            if (pVar4 == '\0') goto LAB_00101629;
            iVar7 = (flat_file->super).record.key_size;
            *(undefined8 *)(__ptr + -8) = 0x1015cd;
            iVar7 = memcmp((void *)test_row._0_8_,key,(long)iVar7);
            *(undefined8 *)(__ptr + -8) = 0x1015e5;
            pVar4 = planck_unit_assert_int_are_equal
                              (tc,0,iVar7,0x9e,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                              );
            if (pVar4 == '\0') goto LAB_00101629;
            iVar7 = (flat_file->super).record.value_size;
            *(undefined8 *)(__ptr + -8) = 0x1015fa;
            iVar7 = memcmp(test_row.key,value,(long)iVar7);
            *(undefined8 *)(__ptr + -8) = 0x101612;
            cVar6 = planck_unit_assert_int_are_equal
                              (tc,0,iVar7,0x9f,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                              );
            goto LAB_00101612;
          }
          location = location + 1;
        }
        *(undefined8 *)(__ptr + -8) = 0x101564;
        cVar6 = planck_unit_assert_true
                          (tc,0,0xa7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                           ,"asserted to fail");
LAB_00101612:
        if (cVar6 == '\0') goto LAB_00101629;
      }
      return;
    }
  }
LAB_00101629:
  *(undefined8 *)(__ptr + -8) = 1;
  uVar3 = *(undefined8 *)(__ptr + -8);
  *(code **)(__ptr + -8) = ftest_delete;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,(int)uVar3);
}

Assistant:

void
ftest_insert(
	planck_unit_test_t	*tc,
	ion_flat_file_t		*flat_file,
	ion_key_t			key,
	ion_value_t			value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_boolean_t		check_result
) {
	ion_status_t status = flat_file_insert(flat_file, key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		ion_byte_t expected_result[flat_file->row_size];

		memset(expected_result, ION_FLAT_FILE_STATUS_OCCUPIED, sizeof(ion_flat_file_row_status_t));
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t), key, flat_file->super.record.key_size);
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size, value, flat_file->super.record.value_size);

		ion_byte_t read_buffer[flat_file->row_size];

		fseek(flat_file->data_file, flat_file->start_of_data, SEEK_SET);

		ion_fpos_t cur_index = 0;

		while (boolean_true) {
			if (1 != fread(read_buffer, flat_file->row_size, 1, flat_file->data_file)) {
				break;
			}

			if (0 == memcmp(read_buffer, expected_result, flat_file->row_size)) {
				ion_flat_file_row_t test_row;
				ion_err_t			err = flat_file_read_row(flat_file, cur_index, &test_row);

				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ION_FLAT_FILE_STATUS_OCCUPIED, test_row.row_status);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.key, key, flat_file->super.record.key_size));
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.value, value, flat_file->super.record.value_size));
				return;
			}

			cur_index++;
		}

		/* If we reach here that means that the record we were looking for wasn't found :( */
		PLANCK_UNIT_SET_FAIL(tc);
	}
}